

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O3

void __thiscall ktxApp::writeId(ktxApp *this,ostream *dst,bool chktest)

{
  undefined8 *puVar1;
  ostream *poVar2;
  long lVar3;
  undefined7 in_register_00000011;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (dst,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  lVar3 = 0x28;
  if ((int)CONCAT71(in_register_00000011,chktest) != 0) {
    lVar3 = (ulong)(this->options->test != 0) * 8 + 0x28;
  }
  puVar1 = *(undefined8 **)((long)&this->_vptr_ktxApp + lVar3);
  std::__ostream_insert<char,std::char_traits<char>>(dst,(char *)*puVar1,puVar1[1]);
  return;
}

Assistant:

void writeId(std::ostream& dst, bool chktest) {
        dst << name << " ";
        dst << (!chktest || !options.test ? version : defaultVersion);
    }